

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_message.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cpp::MessageGenerator::GenerateConstructorBody
          (MessageGenerator *this,Printer *printer,vector<bool,_std::allocator<bool>_> *processed,
          bool copy_constructor)

{
  unsigned_long uVar1;
  bool bVar2;
  bool bVar3;
  ulong uVar4;
  size_type sVar5;
  const_reference ppFVar6;
  pointer pvVar7;
  char *format_00;
  FieldGenerator *pFVar8;
  FieldDescriptor *field_00;
  FieldDescriptor *field_01;
  reference rVar9;
  allocator local_1b9;
  string local_1b8;
  allocator local_191;
  string local_190;
  undefined1 local_170 [8];
  string last_field_name;
  string first_field_name;
  size_t run_length;
  _Node_iterator_base<std::pair<const_google::protobuf::FieldDescriptor_*const,_unsigned_long>,_false>
  local_120;
  const_iterator it;
  FieldDescriptor *field;
  _Bit_type local_108;
  int local_fc;
  string local_f8 [4];
  int i;
  string pod_template;
  anon_class_16_2_3ad1a187 local_c8;
  function<bool_(const_google::protobuf::FieldDescriptor_*)> local_b8;
  undefined1 local_98 [8];
  RunMap runs;
  Formatter format;
  bool copy_constructor_local;
  vector<bool,_std::allocator<bool>_> *processed_local;
  Printer *printer_local;
  MessageGenerator *this_local;
  
  Formatter::Formatter((Formatter *)&runs._M_h._M_single_bucket,printer,&this->variables_);
  local_c8.copy_constructor = copy_constructor;
  local_c8.this = this;
  std::function<bool(google::protobuf::FieldDescriptor_const*)>::
  function<google::protobuf::compiler::cpp::MessageGenerator::GenerateConstructorBody(google::protobuf::io::Printer*,std::vector<bool,std::allocator<bool>>,bool)const::__0,void>
            ((function<bool(google::protobuf::FieldDescriptor_const*)> *)&local_b8,&local_c8);
  anon_unknown_0::FindRuns((RunMap *)local_98,&this->optimized_order_,&local_b8);
  std::function<bool_(const_google::protobuf::FieldDescriptor_*)>::~function(&local_b8);
  std::__cxx11::string::string(local_f8);
  if (copy_constructor) {
    std::__cxx11::string::operator=
              (local_f8,
               "::memcpy(&$first$_, &from.$first$_,\n  static_cast<size_t>(reinterpret_cast<char*>(&$last$_) -\n  reinterpret_cast<char*>(&$first$_)) + sizeof($last$_));\n"
              );
  }
  else {
    std::__cxx11::string::operator=
              (local_f8,
               "::memset(reinterpret_cast<char*>(this) + static_cast<size_t>(\n    reinterpret_cast<char*>(&$first$_) - reinterpret_cast<char*>(this)),\n    0, static_cast<size_t>(reinterpret_cast<char*>(&$last$_) -\n    reinterpret_cast<char*>(&$first$_)) + sizeof($last$_));\n"
              );
  }
  for (local_fc = 0; uVar4 = (ulong)local_fc,
      sVar5 = std::
              vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
              ::size(&this->optimized_order_), uVar4 < sVar5; local_fc = local_fc + 1) {
    rVar9 = std::vector<bool,_std::allocator<bool>_>::operator[](processed,(long)local_fc);
    local_108 = rVar9._M_mask;
    field = (FieldDescriptor *)rVar9._M_p;
    bVar2 = std::_Bit_reference::operator_cast_to_bool((_Bit_reference *)&field);
    if (!bVar2) {
      ppFVar6 = std::
                vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                ::operator[](&this->optimized_order_,(long)local_fc);
      it.
      super__Node_iterator_base<std::pair<const_google::protobuf::FieldDescriptor_*const,_unsigned_long>,_false>
      ._M_cur = (_Node_iterator_base<std::pair<const_google::protobuf::FieldDescriptor_*const,_unsigned_long>,_false>
                 )*ppFVar6;
      local_120._M_cur =
           (__node_type *)
           std::
           unordered_map<const_google::protobuf::FieldDescriptor_*,_unsigned_long,_std::hash<const_google::protobuf::FieldDescriptor_*>,_std::equal_to<const_google::protobuf::FieldDescriptor_*>,_std::allocator<std::pair<const_google::protobuf::FieldDescriptor_*const,_unsigned_long>_>_>
           ::find((unordered_map<const_google::protobuf::FieldDescriptor_*,_unsigned_long,_std::hash<const_google::protobuf::FieldDescriptor_*>,_std::equal_to<const_google::protobuf::FieldDescriptor_*>,_std::allocator<std::pair<const_google::protobuf::FieldDescriptor_*const,_unsigned_long>_>_>
                   *)local_98,(key_type *)&it);
      run_length = (size_t)std::
                           unordered_map<const_google::protobuf::FieldDescriptor_*,_unsigned_long,_std::hash<const_google::protobuf::FieldDescriptor_*>,_std::equal_to<const_google::protobuf::FieldDescriptor_*>,_std::allocator<std::pair<const_google::protobuf::FieldDescriptor_*const,_unsigned_long>_>_>
                           ::end((unordered_map<const_google::protobuf::FieldDescriptor_*,_unsigned_long,_std::hash<const_google::protobuf::FieldDescriptor_*>,_std::equal_to<const_google::protobuf::FieldDescriptor_*>,_std::allocator<std::pair<const_google::protobuf::FieldDescriptor_*const,_unsigned_long>_>_>
                                  *)local_98);
      bVar3 = std::__detail::operator!=
                        (&local_120,
                         (_Node_iterator_base<std::pair<const_google::protobuf::FieldDescriptor_*const,_unsigned_long>,_false>
                          *)&run_length);
      bVar2 = false;
      if (bVar3) {
        pvVar7 = std::__detail::
                 _Node_const_iterator<std::pair<const_google::protobuf::FieldDescriptor_*const,_unsigned_long>,_false,_false>
                 ::operator->((_Node_const_iterator<std::pair<const_google::protobuf::FieldDescriptor_*const,_unsigned_long>,_false,_false>
                               *)&local_120);
        bVar2 = 1 < pvVar7->second;
      }
      if (bVar2) {
        pvVar7 = std::__detail::
                 _Node_const_iterator<std::pair<const_google::protobuf::FieldDescriptor_*const,_unsigned_long>,_false,_false>
                 ::operator->((_Node_const_iterator<std::pair<const_google::protobuf::FieldDescriptor_*const,_unsigned_long>,_false,_false>
                               *)&local_120);
        uVar1 = pvVar7->second;
        FieldName_abi_cxx11_
                  ((string *)((long)&last_field_name.field_2 + 8),
                   (cpp *)it.
                          super__Node_iterator_base<std::pair<const_google::protobuf::FieldDescriptor_*const,_unsigned_long>,_false>
                          ._M_cur,field_00);
        ppFVar6 = std::
                  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                  ::operator[](&this->optimized_order_,(long)local_fc + -1 + uVar1);
        FieldName_abi_cxx11_((string *)local_170,(cpp *)*ppFVar6,field_01);
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_190,"first",&local_191);
        Formatter::Set<std::__cxx11::string>
                  ((Formatter *)&runs._M_h._M_single_bucket,&local_190,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&last_field_name.field_2 + 8));
        std::__cxx11::string::~string((string *)&local_190);
        std::allocator<char>::~allocator((allocator<char> *)&local_191);
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_1b8,"last",&local_1b9);
        Formatter::Set<std::__cxx11::string>
                  ((Formatter *)&runs._M_h._M_single_bucket,&local_1b8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_170);
        std::__cxx11::string::~string((string *)&local_1b8);
        std::allocator<char>::~allocator((allocator<char> *)&local_1b9);
        format_00 = (char *)std::__cxx11::string::c_str();
        Formatter::operator()<>((Formatter *)&runs._M_h._M_single_bucket,format_00);
        local_fc = local_fc + (int)uVar1 + -1;
        std::__cxx11::string::~string((string *)local_170);
        std::__cxx11::string::~string((string *)(last_field_name.field_2._M_local_buf + 8));
      }
      else if (copy_constructor) {
        pFVar8 = FieldGeneratorMap::get
                           (&this->field_generators_,
                            (FieldDescriptor *)
                            it.
                            super__Node_iterator_base<std::pair<const_google::protobuf::FieldDescriptor_*const,_unsigned_long>,_false>
                            ._M_cur);
        (*pFVar8->_vptr_FieldGenerator[0xd])(pFVar8,printer);
      }
      else {
        pFVar8 = FieldGeneratorMap::get
                           (&this->field_generators_,
                            (FieldDescriptor *)
                            it.
                            super__Node_iterator_base<std::pair<const_google::protobuf::FieldDescriptor_*const,_unsigned_long>,_false>
                            ._M_cur);
        (*pFVar8->_vptr_FieldGenerator[0xf])(pFVar8,printer);
      }
    }
  }
  std::__cxx11::string::~string(local_f8);
  std::
  unordered_map<const_google::protobuf::FieldDescriptor_*,_unsigned_long,_std::hash<const_google::protobuf::FieldDescriptor_*>,_std::equal_to<const_google::protobuf::FieldDescriptor_*>,_std::allocator<std::pair<const_google::protobuf::FieldDescriptor_*const,_unsigned_long>_>_>
  ::~unordered_map((unordered_map<const_google::protobuf::FieldDescriptor_*,_unsigned_long,_std::hash<const_google::protobuf::FieldDescriptor_*>,_std::equal_to<const_google::protobuf::FieldDescriptor_*>,_std::allocator<std::pair<const_google::protobuf::FieldDescriptor_*const,_unsigned_long>_>_>
                    *)local_98);
  Formatter::~Formatter((Formatter *)&runs._M_h._M_single_bucket);
  return;
}

Assistant:

void MessageGenerator::GenerateConstructorBody(io::Printer* printer,
                                               std::vector<bool> processed,
                                               bool copy_constructor) const {
  Formatter format(printer, variables_);

  const RunMap runs = FindRuns(
      optimized_order_, [copy_constructor, this](const FieldDescriptor* field) {
        return (copy_constructor && IsPOD(field)) ||
               (!copy_constructor &&
                CanBeManipulatedAsRawBytes(field, options_, scc_analyzer_));
      });

  std::string pod_template;
  if (copy_constructor) {
    pod_template =
        "::memcpy(&$first$_, &from.$first$_,\n"
        "  static_cast<size_t>(reinterpret_cast<char*>(&$last$_) -\n"
        "  reinterpret_cast<char*>(&$first$_)) + sizeof($last$_));\n";
  } else {
    pod_template =
        "::memset(reinterpret_cast<char*>(this) + static_cast<size_t>(\n"
        "    reinterpret_cast<char*>(&$first$_) - "
        "reinterpret_cast<char*>(this)),\n"
        "    0, static_cast<size_t>(reinterpret_cast<char*>(&$last$_) -\n"
        "    reinterpret_cast<char*>(&$first$_)) + sizeof($last$_));\n";
  }

  for (int i = 0; i < optimized_order_.size(); ++i) {
    if (processed[i]) {
      continue;
    }

    const FieldDescriptor* field = optimized_order_[i];
    const auto it = runs.find(field);

    // We only apply the memset technique to runs of more than one field, as
    // assignment is better than memset for generated code clarity.
    if (it != runs.end() && it->second > 1) {
      // Use a memset, then skip run_length fields.
      const size_t run_length = it->second;
      const std::string first_field_name = FieldName(field);
      const std::string last_field_name =
          FieldName(optimized_order_[i + run_length - 1]);

      format.Set("first", first_field_name);
      format.Set("last", last_field_name);

      format(pod_template.c_str());

      i += run_length - 1;
      // ++i at the top of the loop.
    } else {
      if (copy_constructor) {
        field_generators_.get(field).GenerateCopyConstructorCode(printer);
      } else {
        field_generators_.get(field).GenerateConstructorCode(printer);
      }
    }
  }
}